

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psftp.c
# Opt level: O1

_Bool wildcard_iterate(char *filename,_func__Bool_void_ptr_char_ptr *func,void *ctx)

{
  _Bool _Var1;
  size_t sVar2;
  char *pcVar3;
  char *pcVar4;
  SftpWildcardMatcher *swcm;
  char *ptr;
  byte unaff_BPL;
  
  sVar2 = strlen(filename);
  pcVar3 = (char *)safemalloc(sVar2 + 1,1,0);
  _Var1 = wc_unescape(pcVar3,filename);
  if (_Var1) {
    pcVar4 = canonify(pcVar3);
    unaff_BPL = (*func)(ctx,pcVar4);
    safefree(pcVar4);
    safefree(pcVar3);
  }
  else {
    swcm = sftp_begin_wildcard_matching(filename);
    safefree(pcVar3);
    if (swcm != (SftpWildcardMatcher *)0x0) {
      pcVar4 = sftp_wildcard_get_filename(swcm);
      unaff_BPL = 1;
      pcVar3 = pcVar4;
      while (pcVar3 != (char *)0x0) {
        ptr = canonify(pcVar3);
        safefree(pcVar3);
        _Var1 = (*func)(ctx,ptr);
        if (!_Var1) {
          unaff_BPL = 0;
        }
        safefree(ptr);
        pcVar3 = sftp_wildcard_get_filename(swcm);
      }
      if (pcVar4 == (char *)0x0) {
        printf("%s: nothing matched\n",filename);
      }
      sftp_finish_wildcard_matching(swcm);
    }
    if (swcm == (SftpWildcardMatcher *)0x0) {
      unaff_BPL = 0;
    }
  }
  return (_Bool)(unaff_BPL & 1);
}

Assistant:

bool wildcard_iterate(char *filename, bool (*func)(void *, char *), void *ctx)
{
    char *unwcfname, *newname, *cname;
    bool is_wc, toret;

    unwcfname = snewn(strlen(filename)+1, char);
    is_wc = !wc_unescape(unwcfname, filename);

    if (is_wc) {
        SftpWildcardMatcher *swcm = sftp_begin_wildcard_matching(filename);
        bool matched = false;
        sfree(unwcfname);

        if (!swcm)
            return false;

        toret = true;

        while ( (newname = sftp_wildcard_get_filename(swcm)) != NULL ) {
            cname = canonify(newname);
            sfree(newname);
            matched = true;
            if (!func(ctx, cname))
                toret = false;
            sfree(cname);
        }

        if (!matched) {
            /* Politely warn the user that nothing matched. */
            printf("%s: nothing matched\n", filename);
        }

        sftp_finish_wildcard_matching(swcm);
    } else {
        cname = canonify(unwcfname);
        toret = func(ctx, cname);
        sfree(cname);
        sfree(unwcfname);
    }

    return toret;
}